

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_outw_x86_64(CPUX86State *env,uint32_t port,uint32_t data)

{
  cpu_outw_x86_64(env->uc,port,(uint16_t)data);
  return;
}

Assistant:

void helper_outw(CPUX86State *env, uint32_t port, uint32_t data)
{
// #ifdef UNICORN_ARCH_POSTFIX
//     glue(address_space_stw, UNICORN_ARCH_POSTFIX)(env->uc, &env->uc->address_space_io, port, data & 0xffff,
// #else
//     address_space_stw(env->uc, &env->uc->address_space_io, port, data & 0xffff,
// #endif
//                       cpu_get_mem_attrs(env), NULL);
    return cpu_outw(env->uc, port, data);
}